

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O0

Reals __thiscall Omega_h::normalize_vectors_tmpl<2>(Omega_h *this,Reals *vs)

{
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_d8;
  undefined1 local_c8 [8];
  type f;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  Write<double> out;
  int n;
  Reals *vs_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(vs->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((vs->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(vs->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_10 >> 3),2);
  if (((ulong)(vs->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((vs->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(vs->write_).shared_alloc_.alloc >> 3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  Write<double>::Write((Write<double> *)local_70,(LO)(local_20 >> 3),(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  Write<double>::Write((Write<double> *)local_c8,(Write<double> *)local_70);
  Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,vs);
  parallel_for<Omega_h::normalize_vectors_tmpl<2>(Omega_h::Read<double>)::_lambda(int)_1_>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_c8,"normalize_vectors");
  Write<double>::Write(&local_d8,(Write<signed_char> *)local_70);
  Read<double>::Read((Read<double> *)this,&local_d8);
  Write<double>::~Write(&local_d8);
  normalize_vectors_tmpl<2>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_c8);
  Write<double>::~Write((Write<double> *)local_70);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals normalize_vectors_tmpl(Reals vs) {
  auto n = divide_no_remainder(vs.size(), dim);
  auto out = Write<Real>(vs.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector<dim>(out, i, normalize(get_vector<dim>(vs, i)));
  };
  parallel_for(n, f, "normalize_vectors");
  return out;
}